

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::VersionSet::Builder::Apply(Builder *this,VersionEdit *edit)

{
  undefined8 *puVar1;
  int iVar2;
  pointer ppVar3;
  pointer ppVar4;
  int iVar5;
  _Base_ptr p_Var6;
  FileMetaData *this_00;
  size_t i;
  ulong uVar7;
  size_t i_1;
  long lVar8;
  uint64_t number;
  Slice local_40;
  
  lVar8 = 0x10;
  uVar7 = 0;
  while( true ) {
    ppVar3 = (edit->compact_pointers_).
             super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(edit->compact_pointers_).
                       super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) / 0x28) <= uVar7)
    break;
    iVar2 = *(int *)((long)ppVar3 + lVar8 + -0x10);
    puVar1 = (undefined8 *)((long)ppVar3 + lVar8 + -8);
    local_40.data_ = (char *)*puVar1;
    local_40.size_ = puVar1[1];
    Slice::ToString_abi_cxx11_((string *)&number,&local_40);
    std::__cxx11::string::operator=
              ((string *)(this->vset_->compact_pointer_ + iVar2),(string *)&number);
    std::__cxx11::string::_M_dispose();
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 0x28;
  }
  for (p_Var6 = (edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(edit->deleted_files_)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    number = (uint64_t)p_Var6[1]._M_parent;
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)(this->levels_ + (int)p_Var6[1]._M_color),&number);
  }
  lVar8 = 8;
  uVar7 = 0;
  while( true ) {
    ppVar4 = (edit->new_files_).
             super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(edit->new_files_).
                       super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4) / 0x60) <= uVar7)
    break;
    iVar2 = *(int *)((long)ppVar4 + lVar8 + -8);
    this_00 = (FileMetaData *)operator_new(0x58);
    FileMetaData::FileMetaData(this_00,(FileMetaData *)((long)&ppVar4->first + lVar8));
    this_00->refs = 1;
    iVar5 = (int)(this_00->file_size >> 0xe);
    if (iVar5 < 0x65) {
      iVar5 = 100;
    }
    this_00->allowed_seeks = iVar5;
    number = (uint64_t)this_00;
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::erase((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
             *)(this->levels_ + iVar2),&this_00->number);
    std::
    _Rb_tree<leveldb::FileMetaData*,leveldb::FileMetaData*,std::_Identity<leveldb::FileMetaData*>,leveldb::VersionSet::Builder::BySmallestKey,std::allocator<leveldb::FileMetaData*>>
    ::_M_insert_unique<leveldb::FileMetaData*const&>
              ((_Rb_tree<leveldb::FileMetaData*,leveldb::FileMetaData*,std::_Identity<leveldb::FileMetaData*>,leveldb::VersionSet::Builder::BySmallestKey,std::allocator<leveldb::FileMetaData*>>
                *)this->levels_[iVar2].added_files,(FileMetaData **)&number);
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 0x60;
  }
  return;
}

Assistant:

void Apply(VersionEdit* edit) {
    // Update compaction pointers
    for (size_t i = 0; i < edit->compact_pointers_.size(); i++) {
      const int level = edit->compact_pointers_[i].first;
      vset_->compact_pointer_[level] =
          edit->compact_pointers_[i].second.Encode().ToString();
    }

    // Delete files
    for (const auto& deleted_file_set_kvp : edit->deleted_files_) {
      const int level = deleted_file_set_kvp.first;
      const uint64_t number = deleted_file_set_kvp.second;
      levels_[level].deleted_files.insert(number);
    }

    // Add new files
    for (size_t i = 0; i < edit->new_files_.size(); i++) {
      const int level = edit->new_files_[i].first;
      FileMetaData* f = new FileMetaData(edit->new_files_[i].second);
      f->refs = 1;

      // We arrange to automatically compact this file after
      // a certain number of seeks.  Let's assume:
      //   (1) One seek costs 10ms
      //   (2) Writing or reading 1MB costs 10ms (100MB/s)
      //   (3) A compaction of 1MB does 25MB of IO:
      //         1MB read from this level
      //         10-12MB read from next level (boundaries may be misaligned)
      //         10-12MB written to next level
      // This implies that 25 seeks cost the same as the compaction
      // of 1MB of data.  I.e., one seek costs approximately the
      // same as the compaction of 40KB of data.  We are a little
      // conservative and allow approximately one seek for every 16KB
      // of data before triggering a compaction.
      f->allowed_seeks = static_cast<int>((f->file_size / 16384U));
      if (f->allowed_seeks < 100) f->allowed_seeks = 100;

      levels_[level].deleted_files.erase(f->number);
      levels_[level].added_files->insert(f);
    }
  }